

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O1

int xmlBufErase(xmlBufPtr buf,size_t len)

{
  size_t sVar1;
  ulong uVar2;
  
  if ((buf != (xmlBufPtr)0x0) && (buf->error == 0)) {
    uVar2 = (ulong)buf->compat_size;
    if ((uVar2 < 0x7fffffff) && (buf->size != uVar2)) {
      buf->size = uVar2;
    }
    uVar2 = (ulong)buf->compat_use;
    if ((uVar2 < 0x7fffffff) && (buf->use != uVar2)) {
      buf->use = uVar2;
    }
    sVar1 = buf->use - len;
    if (len <= buf->use) {
      buf->use = sVar1;
      buf->content[sVar1] = '\0';
      uVar2 = buf->size;
      if (0x7ffffffe < uVar2) {
        uVar2 = 0x7fffffff;
      }
      buf->compat_size = (uint)uVar2;
      uVar2 = 0x7fffffff;
      if (buf->use < 0x7fffffff) {
        uVar2 = buf->use;
      }
      buf->compat_use = (uint)uVar2;
      return 0;
    }
  }
  return -1;
}

Assistant:

int
xmlBufErase(xmlBufPtr buf, size_t len) {
    if ((buf == NULL) || (buf->error))
        return(-1);
    CHECK_COMPAT(buf)
    if (len > buf->use)
        return(-1);
    buf->use -= len;
    buf->content[buf->use] = 0;
    UPDATE_COMPAT(buf)
    return(0);
}